

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void bounty_credit(CHAR_DATA *ch,int credit)

{
  bool bVar1;
  int iVar2;
  uint in_ESI;
  long in_RDI;
  int old_credit;
  int i;
  char blog [500];
  char buf2 [300];
  char buf [300];
  char *in_stack_00000d98;
  CHAR_DATA *in_stack_00000da0;
  CHAR_DATA *in_stack_fffffffffffffb88;
  int iVar3;
  CHAR_DATA *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  CHAR_DATA *in_stack_fffffffffffffc00;
  char local_268 [304];
  char local_138 [300];
  uint local_c;
  long local_8;
  
  iVar2 = (int)*(short *)(*(long *)(in_RDI + 0xc0) + 0xb08);
  local_c = in_ESI;
  local_8 = in_RDI;
  bVar1 = is_npc(in_stack_fffffffffffffb88);
  if (!bVar1) {
    sprintf(local_138,"You receive %i bounty credits for your kill!\n\r",(ulong)local_c);
    send_to_char(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    *(short *)(*(long *)(local_8 + 0xc0) + 0xb08) =
         *(short *)(*(long *)(local_8 + 0xc0) + 0xb08) + (short)local_c;
    for (iVar3 = 1; iVar3 < 5; iVar3 = iVar3 + 1) {
      if ((bounty_table[iVar3].credits_required <=
           (int)*(short *)(*(long *)(local_8 + 0xc0) + 0xb08)) &&
         (iVar2 < bounty_table[iVar3].credits_required)) {
        sprintf(local_138,"You gain a title within the Bounty Guild, advancing to %s!\n\r",
                bounty_table[iVar3].rank_extitle);
        send_to_char(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        sprintf(local_268,", %s",bounty_table[iVar3].rank_extitle);
        set_extitle(in_stack_00000da0,in_stack_00000d98);
        sprintf(local_268,"%s has advanced to the position of %s.",*(undefined8 *)(local_8 + 0xe8),
                bounty_table[iVar3].rank_extitle);
        bounty_cb((char *)CONCAT44(iVar3,iVar2));
        sprintf(&stack0xfffffffffffffb98,"%s advances to %s.",*(undefined8 *)(local_8 + 0xe8),
                bounty_table[iVar3].rank_extitle);
        bounty_log(in_stack_fffffffffffffba0);
        *(int *)(*(long *)(local_8 + 0xc0) + 0xd4c) =
             *(int *)(*(long *)(local_8 + 0xc0) + 0xd4c) + 1;
        update_cskills(in_stack_fffffffffffffc00);
      }
    }
  }
  return;
}

Assistant:

void bounty_credit(CHAR_DATA *ch, int credit)
{
	char buf[300], buf2[300], blog[500];
	int i, old_credit = ch->pcdata->bounty_credits;

	if (is_npc(ch))
		return;

	sprintf(buf, "You receive %i bounty credits for your kill!\n\r", credit);
	send_to_char(buf, ch);
	ch->pcdata->bounty_credits += credit;

	for (i = 1; i < MAX_BOUNTY; i++)
	{
		if (ch->pcdata->bounty_credits >= bounty_table[i].credits_required
			&& old_credit < bounty_table[i].credits_required)
		{
			sprintf(buf, "You gain a title within the Bounty Guild, advancing to %s!\n\r", bounty_table[i].rank_extitle);
			send_to_char(buf, ch);

			sprintf(buf2, ", %s", bounty_table[i].rank_extitle);
			set_extitle(ch, buf2);

			sprintf(buf2, "%s has advanced to the position of %s.", ch->name, bounty_table[i].rank_extitle);
			bounty_cb(buf2);

			sprintf(blog, "%s advances to %s.", ch->name, bounty_table[i].rank_extitle);
			bounty_log(blog);

			ch->pcdata->cabal_level++;
			update_cskills(ch);
		}
	}
}